

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O1

void apply_imputation_results<std::vector<ImputedData<int,double>,std::allocator<ImputedData<int,double>>>,InputData<double,int>>
               (vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>
                *impute_vec,Imputer *imputer,InputData<double,_int> *input_data,int nthreads)

{
  pointer pIVar1;
  double dVar2;
  int iVar3;
  int *piVar4;
  pointer pIVar5;
  pointer pdVar6;
  unsigned_long uVar7;
  size_t sVar8;
  pointer pcVar9;
  size_t sVar10;
  long lVar11;
  long lVar12;
  pointer piVar13;
  double *pdVar14;
  double *pdVar15;
  double *pdVar16;
  int iVar17;
  ulong uVar18;
  double *pdVar19;
  double *pdVar20;
  size_t sVar21;
  long lVar22;
  size_t sVar23;
  double dVar24;
  vector<unsigned_long,_std::allocator<unsigned_long>_> row_pos;
  allocator_type local_79;
  vector<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_> *local_78;
  InputData<double,_int> *local_70;
  int *local_68;
  Imputer *local_60;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_50;
  value_type_conflict1 local_38;
  
  local_78 = impute_vec;
  local_70 = input_data;
  local_60 = imputer;
  if (input_data->Xc_indptr != (int *)0x0) {
    local_38 = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_50,input_data->nrows,&local_38,&local_79);
    if (input_data->ncols_numeric != 0) {
      pdVar20 = input_data->Xc;
      local_68 = input_data->Xc_indptr;
      uVar18 = 0;
      do {
        lVar22 = (long)local_68[uVar18];
        iVar17 = local_68[uVar18 + 1];
        if (local_68[uVar18] < iVar17) {
          piVar4 = local_70->Xc_ind;
          pIVar5 = (local_78->
                   super__Vector_base<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pdVar6 = (local_60->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          do {
            if (0x7fefffffffffffff < (ulong)ABS(pdVar20[lVar22])) {
              iVar3 = piVar4[lVar22];
              uVar7 = local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start[iVar3];
              dVar2 = *(double *)
                       (*(long *)&pIVar5[iVar3].sp_num_weight.
                                  super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                  super__Vector_impl_data + uVar7 * 8);
              if ((dVar2 <= 0.0) ||
                 (dVar24 = *(double *)
                            (*(long *)&pIVar5[iVar3].sp_num_sum.
                                       super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                       super__Vector_impl_data + uVar7 * 8),
                 0x7fefffffffffffff < (ulong)ABS(dVar24))) {
                dVar24 = pdVar6[uVar18];
              }
              else {
                dVar24 = dVar24 / dVar2;
              }
              pdVar20[lVar22] = dVar24;
              local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3] = uVar7 + 1;
            }
            lVar22 = lVar22 + 1;
          } while (iVar17 != lVar22);
        }
        uVar18 = uVar18 + 1;
        input_data = local_70;
      } while (uVar18 < local_70->ncols_numeric);
    }
    if (local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_50.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_50.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_50.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  sVar8 = input_data->nrows;
  if (sVar8 != 0) {
    piVar4 = local_70->categ_data;
    pcVar9 = (local_70->has_missing).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pIVar5 = (local_78->
             super__Vector_base<ImputedData<int,_double>,_std::allocator<ImputedData<int,_double>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    sVar21 = 0;
    do {
      if (pcVar9[sVar21] != '\0') {
        pIVar1 = pIVar5 + sVar21;
        sVar10 = pIVar5[sVar21].n_missing_num;
        if (sVar10 != 0) {
          lVar22 = *(long *)&(pIVar1->num_weight).
                             super__Vector_base<double,_std::allocator<double>_>._M_impl.
                             super__Vector_impl_data;
          lVar11 = *(long *)&(pIVar1->missing_num).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data;
          pdVar6 = (local_60->col_means).super__Vector_base<double,_std::allocator<double>_>._M_impl
                   .super__Vector_impl_data._M_start;
          pdVar20 = local_70->numeric_data;
          sVar23 = 0;
          do {
            lVar12 = *(long *)(lVar11 + sVar23 * 8);
            dVar2 = *(double *)(lVar22 + sVar23 * 8);
            if ((dVar2 <= 0.0) ||
               (dVar24 = *(double *)
                          (*(long *)&(pIVar1->num_sum).
                                     super__Vector_base<double,_std::allocator<double>_>._M_impl +
                          sVar23 * 8), 0x7fefffffffffffff < (ulong)ABS(dVar24))) {
              dVar24 = pdVar6[lVar12];
            }
            else {
              dVar24 = dVar24 / dVar2;
            }
            pdVar20[sVar21 + lVar12 * sVar8] = dVar24;
            sVar23 = sVar23 + 1;
          } while (sVar10 != sVar23);
        }
        sVar10 = pIVar1->n_missing_cat;
        if (sVar10 != 0) {
          lVar22 = *(long *)&(pIVar1->cat_sum).
                             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                             ._M_impl.super__Vector_impl_data;
          lVar11 = *(long *)&(pIVar1->missing_cat).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data;
          piVar13 = (local_60->col_modes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start;
          sVar23 = 0;
          do {
            lVar12 = *(long *)(lVar11 + sVar23 * 8);
            pdVar14 = *(double **)(lVar22 + lVar12 * 0x18);
            pdVar15 = *(double **)(lVar22 + 8 + lVar12 * 0x18);
            pdVar20 = pdVar14 + 1;
            pdVar16 = pdVar14;
            pdVar19 = pdVar14;
            if (pdVar20 != pdVar15 && pdVar14 != pdVar15) {
              do {
                pdVar19 = pdVar20;
                if (*pdVar20 < *pdVar16 || *pdVar20 == *pdVar16) {
                  pdVar19 = pdVar16;
                }
                pdVar20 = pdVar20 + 1;
                pdVar16 = pdVar19;
              } while (pdVar20 != pdVar15);
            }
            iVar17 = (int)((ulong)((long)pdVar19 - (long)pdVar14) >> 3);
            piVar4[sVar21 + lVar12 * sVar8] = iVar17;
            if ((iVar17 == 0) && (*pdVar14 <= 0.0)) {
              piVar4[sVar21 + lVar12 * sVar8] = piVar13[lVar12];
            }
            sVar23 = sVar23 + 1;
          } while (sVar23 != sVar10);
        }
      }
      sVar21 = sVar21 + 1;
    } while (sVar21 != sVar8);
  }
  return;
}

Assistant:

void apply_imputation_results(imp_arr    &impute_vec,
                              Imputer    &imputer,
                              InputData  &input_data,
                              int        nthreads)
{
    size_t col;

    if (input_data.Xc_indptr != NULL)
    {
        std::vector<size_t> row_pos(input_data.nrows, 0);
        size_t row;

        for (size_t col = 0; col < input_data.ncols_numeric; col++)
        {
            for (auto ix = input_data.Xc_indptr[col]; ix < input_data.Xc_indptr[col + 1]; ix++)
            {
                if (is_na_or_inf(input_data.Xc[ix]))
                {
                    row = input_data.Xc_ind[ix];
                    if (impute_vec[row].sp_num_weight[row_pos[row]] > 0 && !is_na_or_inf(impute_vec[row].sp_num_sum[row_pos[row]]))
                        input_data.Xc[ix]
                            =
                        impute_vec[row].sp_num_sum[row_pos[row]]
                            /
                        impute_vec[row].sp_num_weight[row_pos[row]];
                    else
                        input_data.Xc[ix]
                            =
                        imputer.col_means[col];

                    row_pos[row]++;
                }
            }
        }
    }

    #pragma omp parallel for schedule(dynamic) num_threads(nthreads) shared(input_data, impute_vec, imputer) private(col)
    for (size_t_for row = 0; row < (decltype(row))input_data.nrows; row++)
    {
        if (input_data.has_missing[row])
        {
            for (size_t ix = 0; ix < impute_vec[row].n_missing_num; ix++)
            {
                col = impute_vec[row].missing_num[ix];
                if (impute_vec[row].num_weight[ix] > 0 && !is_na_or_inf(impute_vec[row].num_sum[ix]))
                    input_data.numeric_data[row + col * input_data.nrows]
                        =
                    impute_vec[row].num_sum[ix] / impute_vec[row].num_weight[ix];
                else
                    input_data.numeric_data[row + col * input_data.nrows]
                        =
                    imputer.col_means[col];
            }

            for (size_t ix = 0; ix < impute_vec[row].n_missing_cat; ix++)
            {
                col = impute_vec[row].missing_cat[ix];
                input_data.categ_data[row + col * input_data.nrows]
                    =
                std::distance(impute_vec[row].cat_sum[col].begin(),
                              std::max_element(impute_vec[row].cat_sum[col].begin(),
                                                 impute_vec[row].cat_sum[col].end()));

                if (input_data.categ_data[row + col * input_data.nrows] == 0 && impute_vec[row].cat_sum[col][0] <= 0)
                    input_data.categ_data[row + col * input_data.nrows]
                        =
                    imputer.col_modes[col];
            }
        }
    }
}